

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O3

void __thiscall
slang::ast::RecursiveStructMemberIterator::RecursiveStructMemberIterator
          (RecursiveStructMemberIterator *this,ConstantValue *startVal,Type *startType)

{
  SyntaxNode *pSVar1;
  Type *pTVar2;
  Type *pTVar3;
  
  (this->curr).valIndex = 0;
  (this->curr).fieldIt._M_current = (FieldSymbol **)0x0;
  (this->curr).fieldEnd._M_current = (FieldSymbol **)0x0;
  (this->stack).super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>.data_ =
       (pointer)(this->stack).
                super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>.firstElement
  ;
  (this->stack).super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>.len = 0;
  (this->stack).super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>.cap = 4;
  (this->curr).val = startVal;
  (this->curr).type = startType;
  pTVar2 = startType->canonical;
  if (pTVar2 == (Type *)0x0) {
    Type::resolveCanonical(startType);
    pTVar2 = startType->canonical;
  }
  if ((pTVar2->super_Symbol).kind == UnpackedStructType) {
    pTVar2 = (this->curr).type;
    pTVar3 = pTVar2->canonical;
    if (pTVar3 == (Type *)0x0) {
      Type::resolveCanonical(pTVar2);
      pTVar3 = pTVar2->canonical;
    }
    pSVar1 = pTVar3[1].super_Symbol.originatingSyntax;
    pTVar2 = pTVar3[1].canonical;
    (this->curr).fieldIt._M_current = (FieldSymbol **)pSVar1;
    (this->curr).fieldEnd._M_current = (FieldSymbol **)(&pSVar1->kind + (long)pTVar2 * 2);
    prepNext(this);
  }
  return;
}

Assistant:

RecursiveStructMemberIterator(const ConstantValue& startVal, const Type& startType) {
        curr.val = &startVal;
        curr.type = &startType;

        if (curr.type->isUnpackedStruct()) {
            auto fields = curr.type->getCanonicalType().as<UnpackedStructType>().fields;
            curr.fieldIt = fields.begin();
            curr.fieldEnd = fields.end();
            prepNext();
        }
    }